

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::SerializeWithCachedSizes
          (SupportVectorClassifier *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  int32 value;
  uint32 uVar2;
  Type *value_00;
  int iVar3;
  double *pdVar4;
  int iVar5;
  
  if (this->kernel_ != (Kernel *)0x0 &&
      this != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->kernel_->super_MessageLite,output);
  }
  iVar5 = (this->numberofsupportvectorsperclass_).current_size_;
  if (0 < iVar5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x12);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_numberofsupportvectorsperclass_cached_byte_size_);
    iVar5 = (this->numberofsupportvectorsperclass_).current_size_;
  }
  iVar3 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
    iVar3 = 0;
  }
  for (; iVar5 != iVar3; iVar3 = iVar3 + 1) {
    value = numberofsupportvectorsperclass(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint32SignExtended(output,value);
  }
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 4) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&((this->supportVectors_).sparsesupportvectors_)->super_MessageLite,output);
  }
  iVar5 = (this->coefficients_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar3 = 0; iVar5 != iVar3; iVar3 = iVar3 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                         (&(this->coefficients_).super_RepeatedPtrFieldBase,iVar3);
    google::protobuf::internal::WireFormatLite::WriteMessage(5,&value_00->super_MessageLite,output);
  }
  if (0 < (this->rho_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x32);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_rho_cached_byte_size_);
    pRVar1 = (this->rho_).rep_;
    pdVar4 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pdVar4 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar4,(this->rho_).current_size_,output);
  }
  if (0 < (this->proba_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x3a);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_proba_cached_byte_size_);
    pRVar1 = (this->proba_).rep_;
    pdVar4 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pdVar4 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar4,(this->proba_).current_size_,output);
  }
  if (0 < (this->probb_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x42);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_probb_cached_byte_size_);
    pRVar1 = (this->probb_).rep_;
    pdVar4 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pdVar4 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar4,(this->probb_).current_size_,output);
  }
  uVar2 = this->_oneof_case_[1];
  if (uVar2 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    uVar2 = this->_oneof_case_[1];
  }
  if (uVar2 == 0x65) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void SupportVectorClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SupportVectorClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->kernel_, output);
  }

  // repeated int32 numberOfSupportVectorsPerClass = 2;
  if (this->numberofsupportvectorsperclass_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_numberofsupportvectorsperclass_cached_byte_size_);
  }
  for (int i = 0, n = this->numberofsupportvectorsperclass_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->numberofsupportvectorsperclass(i), output);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
  if (has_sparsesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *supportVectors_.sparsesupportvectors_, output);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
  if (has_densesupportvectors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *supportVectors_.densesupportvectors_, output);
  }

  // repeated .CoreML.Specification.Coefficients coefficients = 5;
  for (unsigned int i = 0, n = this->coefficients_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      5, this->coefficients(i), output);
  }

  // repeated double rho = 6;
  if (this->rho_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_rho_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->rho().data(), this->rho_size(), output);
  }

  // repeated double probA = 7;
  if (this->proba_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(7, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_proba_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->proba().data(), this->proba_size(), output);
  }

  // repeated double probB = 8;
  if (this->probb_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(8, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_probb_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->probb().data(), this->probb_size(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SupportVectorClassifier)
}